

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::
ConstructorsAndUnsizedDeclInvalidConstructors1<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ConstructorsAndUnsizedDeclInvalidConstructors1<glcts::ArraysOfArrays::Interface::GL>
           *this,TestShaderType tested_shader_type)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  ulong *puVar4;
  TestError *pTVar5;
  long *plVar6;
  size_type *psVar7;
  string shader_source;
  string base_variable_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  long *local_280;
  long local_278;
  long local_270;
  long lStack_268;
  long *local_260;
  long local_258;
  long local_250;
  long lStack_248;
  long *local_240;
  long local_238;
  long local_230;
  long lStack_228;
  long *local_220;
  long local_218;
  long local_210;
  long lStack_208;
  long *local_200;
  long local_1f8;
  long local_1f0;
  long lStack_1e8;
  long *local_1e0;
  long local_1d8;
  long local_1d0;
  long lStack_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  long *local_1a0;
  long local_198;
  long local_190;
  long lStack_188;
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  long *local_140;
  long local_138;
  long local_130;
  long lStack_128;
  long *local_120;
  long local_118;
  long local_110;
  long lStack_108;
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  ConstructorsAndUnsizedDeclInvalidConstructors1<glcts::ArraysOfArrays::Interface::GL> *local_60;
  long local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = 0;
  local_60 = this;
  do {
    lVar1 = 0x2238c78;
    if (supported_variable_types_map._16_8_ != 0) {
      lVar1 = 0x2238c78;
      lVar2 = supported_variable_types_map._16_8_;
      do {
        if ((int)(&opaque_var_types)[local_58] <= *(int *)(lVar2 + 0x20)) {
          lVar1 = lVar2;
        }
        lVar2 = *(long *)(lVar2 + 0x10 +
                         (ulong)(*(int *)(lVar2 + 0x20) < (int)(&opaque_var_types)[local_58]) * 8);
      } while (lVar2 != 0);
    }
    lVar2 = 0x2238c78;
    if ((lVar1 != 0x2238c78) &&
       (lVar2 = lVar1, (int)(&opaque_var_types)[local_58] < *(int *)(lVar1 + 0x20))) {
      lVar2 = 0x2238c78;
    }
    if (lVar2 == 0x2238c78) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Type not found.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x88e);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::operator+(&local_50,"uniform ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (lVar2 + 0x48));
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_240 = &local_230;
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_230 = *plVar6;
      lStack_228 = plVar3[3];
    }
    else {
      local_230 = *plVar6;
      local_240 = (long *)*plVar3;
    }
    local_238 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_240,*(ulong *)(lVar2 + 0x28));
    local_200 = &local_1f0;
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_1f0 = *plVar6;
      lStack_1e8 = plVar3[3];
    }
    else {
      local_1f0 = *plVar6;
      local_200 = (long *)*plVar3;
    }
    local_1f8 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_200);
    local_1e0 = &local_1d0;
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_1d0 = *plVar6;
      lStack_1c8 = plVar3[3];
    }
    else {
      local_1d0 = *plVar6;
      local_1e0 = (long *)*plVar3;
    }
    local_1d8 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1e0);
    local_180 = &local_170;
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_170 = *plVar6;
      lStack_168 = plVar3[3];
    }
    else {
      local_170 = *plVar6;
      local_180 = (long *)*plVar3;
    }
    local_178 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_180,*(ulong *)(lVar2 + 0x48));
    local_e0 = &local_d0;
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_d0 = *plVar6;
      lStack_c8 = plVar3[3];
    }
    else {
      local_d0 = *plVar6;
      local_e0 = (long *)*plVar3;
    }
    local_d8 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_e0);
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_70 = *plVar6;
      lStack_68 = plVar3[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar6;
      local_80 = (long *)*plVar3;
    }
    local_78 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_80,*(ulong *)(lVar2 + 0x28));
    local_c0 = &local_b0;
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_b0 = *plVar6;
      lStack_a8 = plVar3[3];
    }
    else {
      local_b0 = *plVar6;
      local_c0 = (long *)*plVar3;
    }
    local_b8 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_c0);
    local_a0 = &local_90;
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_90 = *plVar6;
      lStack_88 = plVar3[3];
    }
    else {
      local_90 = *plVar6;
      local_a0 = (long *)*plVar3;
    }
    local_98 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_a0);
    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
    psVar7 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1c0.field_2._M_allocated_capacity = *psVar7;
      local_1c0.field_2._8_8_ = plVar3[3];
    }
    else {
      local_1c0.field_2._M_allocated_capacity = *psVar7;
      local_1c0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_1c0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_1c0,*(ulong *)(lVar2 + 0x48));
    local_280 = &local_270;
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_270 = *plVar6;
      lStack_268 = plVar3[3];
    }
    else {
      local_270 = *plVar6;
      local_280 = (long *)*plVar3;
    }
    local_278 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_280);
    local_260 = &local_250;
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_250 = *plVar6;
      lStack_248 = plVar3[3];
    }
    else {
      local_250 = *plVar6;
      local_260 = (long *)*plVar3;
    }
    local_258 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_260,*(ulong *)(lVar2 + 0x28));
    local_220 = &local_210;
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_210 = *plVar6;
      lStack_208 = plVar3[3];
    }
    else {
      local_210 = *plVar6;
      local_220 = (long *)*plVar3;
    }
    local_218 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_220);
    local_1a0 = &local_190;
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_190 = *plVar6;
      lStack_188 = plVar3[3];
    }
    else {
      local_190 = *plVar6;
      local_1a0 = (long *)*plVar3;
    }
    local_198 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1a0);
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_110 = *plVar6;
      lStack_108 = plVar3[3];
      local_120 = &local_110;
    }
    else {
      local_110 = *plVar6;
      local_120 = (long *)*plVar3;
    }
    local_118 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_120,*(ulong *)(lVar2 + 0x48));
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_f0 = *plVar6;
      lStack_e8 = plVar3[3];
      local_100 = &local_f0;
    }
    else {
      local_f0 = *plVar6;
      local_100 = (long *)*plVar3;
    }
    local_f8 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_100);
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_130 = *plVar6;
      lStack_128 = plVar3[3];
      local_140 = &local_130;
    }
    else {
      local_130 = *plVar6;
      local_140 = (long *)*plVar3;
    }
    local_138 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_140,*(ulong *)(lVar2 + 0x28));
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    psVar7 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_2a0.field_2._M_allocated_capacity = *psVar7;
      local_2a0.field_2._8_8_ = plVar3[3];
    }
    else {
      local_2a0.field_2._M_allocated_capacity = *psVar7;
      local_2a0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_2a0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_2a0);
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    psVar7 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_160.field_2._M_allocated_capacity = *psVar7;
      local_160.field_2._8_8_ = plVar3[3];
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar7;
      local_160._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_160._M_string_length = plVar3[1];
    *plVar3 = (long)psVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_100 != &local_f0) {
      operator_delete(local_100,local_f0 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    if (local_1a0 != &local_190) {
      operator_delete(local_1a0,local_190 + 1);
    }
    if (local_220 != &local_210) {
      operator_delete(local_220,local_210 + 1);
    }
    if (local_260 != &local_250) {
      operator_delete(local_260,local_250 + 1);
    }
    if (local_280 != &local_270) {
      operator_delete(local_280,local_270 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0,local_90 + 1);
    }
    if (local_c0 != &local_b0) {
      operator_delete(local_c0,local_b0 + 1);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_e0 != &local_d0) {
      operator_delete(local_e0,local_d0 + 1);
    }
    if (local_180 != &local_170) {
      operator_delete(local_180,local_170 + 1);
    }
    if (local_1e0 != &local_1d0) {
      operator_delete(local_1e0,local_1d0 + 1);
    }
    if (local_200 != &local_1f0) {
      operator_delete(local_200,local_1f0 + 1);
    }
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_2a0,&local_160,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &shader_start_abi_cxx11_);
    std::operator+(&local_1c0,"    const ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (lVar2 + 0x28));
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1c0);
    local_280 = &local_270;
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_270 = *plVar6;
      lStack_268 = plVar3[3];
    }
    else {
      local_270 = *plVar6;
      local_280 = (long *)*plVar3;
    }
    local_278 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_280,*(ulong *)(lVar2 + 0x28));
    local_260 = &local_250;
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_250 = *plVar6;
      lStack_248 = plVar3[3];
    }
    else {
      local_250 = *plVar6;
      local_260 = (long *)*plVar3;
    }
    local_258 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_260);
    local_220 = &local_210;
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_210 = *plVar6;
      lStack_208 = plVar3[3];
    }
    else {
      local_210 = *plVar6;
      local_220 = (long *)*plVar3;
    }
    local_218 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_220,*(ulong *)(lVar2 + 0x28));
    local_1a0 = &local_190;
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_190 = *plVar6;
      lStack_188 = plVar3[3];
    }
    else {
      local_190 = *plVar6;
      local_1a0 = (long *)*plVar3;
    }
    local_198 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_1a0);
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_110 = *plVar6;
      lStack_108 = plVar3[3];
      local_120 = &local_110;
    }
    else {
      local_110 = *plVar6;
      local_120 = (long *)*plVar3;
    }
    local_118 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_120,*(ulong *)(lVar2 + 0x28));
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_f0 = *plVar6;
      lStack_e8 = plVar3[3];
      local_100 = &local_f0;
    }
    else {
      local_f0 = *plVar6;
      local_100 = (long *)*plVar3;
    }
    local_f8 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_100);
    plVar6 = plVar3 + 2;
    if ((long *)*plVar3 == plVar6) {
      local_130 = *plVar6;
      lStack_128 = plVar3[3];
      local_140 = &local_130;
    }
    else {
      local_130 = *plVar6;
      local_140 = (long *)*plVar3;
    }
    local_138 = plVar3[1];
    *plVar3 = (long)plVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_2a0,(ulong)local_140);
    if (local_140 != &local_130) {
      operator_delete(local_140,local_130 + 1);
    }
    if (local_100 != &local_f0) {
      operator_delete(local_100,local_f0 + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,local_110 + 1);
    }
    if (local_1a0 != &local_190) {
      operator_delete(local_1a0,local_190 + 1);
    }
    if (local_220 != &local_210) {
      operator_delete(local_220,local_210 + 1);
    }
    if (local_260 != &local_250) {
      operator_delete(local_260,local_250 + 1);
    }
    if (local_280 != &local_270) {
      operator_delete(local_280,local_270 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x887);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    puVar4 = &set_tesseation_abi_cxx11_;
    switch(tested_shader_type) {
    case VERTEX_SHADER_TYPE:
      std::__cxx11::string::append((char *)&local_2a0);
      break;
    case GEOMETRY_SHADER_TYPE:
      puVar4 = &emit_quad_abi_cxx11_;
    case TESSELATION_CONTROL_SHADER_TYPE:
      std::__cxx11::string::_M_append((char *)&local_2a0,*puVar4);
    }
    std::__cxx11::string::_M_append((char *)&local_2a0,shader_end_abi_cxx11_);
    (*(local_60->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
      super_TestNode._vptr_TestNode[8])(local_60,(ulong)tested_shader_type,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    local_58 = local_58 + 1;
  } while (local_58 != 0xf);
  return;
}

Assistant:

void ConstructorsAndUnsizedDeclInvalidConstructors1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	int num_var_types = sizeof(opaque_var_types) / sizeof(opaque_var_types[0]);

	for (int var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(opaque_var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string base_variable_string =
				"uniform " + var_iterator->second.precision + " " + var_iterator->second.type + " my_sampler1;\n" +
				"uniform " + var_iterator->second.precision + " " + var_iterator->second.type + " my_sampler2;\n" +
				"uniform " + var_iterator->second.precision + " " + var_iterator->second.type + " my_sampler3;\n" +
				"uniform " + var_iterator->second.precision + " " + var_iterator->second.type + " my_sampler4;\n\n";

			std::string shader_source = base_variable_string + shader_start;
			shader_source += "    const " + var_iterator->second.type + "[2][2] x = " + var_iterator->second.type +
							 "[2][2](" + var_iterator->second.type + "[2](my_sampler1, my_sampler2), " +
							 var_iterator->second.type + "[2](my_sampler3, my_sampler4));\n\n";

			/* End main */
			DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

			/* Execute test */
			this->execute_negative_test(tested_shader_type, shader_source);
		} /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}